

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeMinimumRequired.cxx
# Opt level: O3

bool __thiscall
cmCMakeMinimumRequired::InitialPass
          (cmCMakeMinimumRequired *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  cmCMakeMinimumRequired *this_00;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ostream *poVar11;
  char *__s;
  size_t sVar12;
  pointer __x;
  uint required_minor;
  uint required_major;
  uint required_tweak;
  uint required_patch;
  string version_min;
  string version_string;
  string version_max;
  ostringstream e;
  string local_238;
  uint local_218;
  uint local_214;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  long local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  char *local_1f0;
  long local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  cmCMakeMinimumRequired *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = &local_1e0;
  local_1e8 = 0;
  local_1e0 = '\0';
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pbVar2) {
    bVar4 = false;
    local_1d0 = this;
    do {
      iVar5 = std::__cxx11::string::compare((char *)__x);
      if (iVar5 == 0) {
        bVar4 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)__x);
        if (iVar5 == 0) {
          if (bVar4) {
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"called with no value for VERSION.","");
            cmCommand::SetError(&local_1d0->super_cmCommand,(string *)local_1a8);
            goto LAB_0022e708;
          }
        }
        else {
          if (!bVar4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->UnknownArguments,__x);
            goto LAB_0022e2f7;
          }
          std::__cxx11::string::_M_assign((string *)&local_1f0);
        }
        bVar4 = false;
      }
LAB_0022e2f7:
      this_00 = local_1d0;
      __x = __x + 1;
    } while (__x != pbVar2);
    this = local_1d0;
    if (bVar4) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"called with no value for VERSION.","");
      cmCommand::SetError(&this_00->super_cmCommand,(string *)local_1a8);
LAB_0022e708:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      bVar4 = false;
      goto LAB_0022e7f2;
    }
  }
  if (local_1e8 == 0) {
    local_1a8._8_8_ = 0;
    local_1a8[0x10] = '\0';
    local_1a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_1a8 + 0x10);
    bVar4 = EnforceUnknownArguments(this,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1a8 + 0x10)) goto LAB_0022e7f2;
    local_200._M_allocated_capacity = CONCAT71(local_1a8._17_7_,local_1a8[0x10]);
    local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_;
  }
  else {
    lVar10 = std::__cxx11::string::find((char *)&local_1f0,0x4fd444,0);
    std::__cxx11::string::substr((ulong)&local_210,(ulong)&local_1f0);
    if (lVar10 == -1) {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_local_buf[0] = '\0';
LAB_0022e498:
      pcVar3 = (this->super_cmCommand).Makefile;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1a8 + 0x10);
      local_1a8._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_MINIMUM_REQUIRED_VERSION","");
      cmMakefile::AddDefinition(pcVar3,(string *)local_1a8,local_210->_M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != paVar1) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      uVar6 = cmVersion::GetMajorVersion();
      uVar7 = cmVersion::GetMinorVersion();
      uVar8 = cmVersion::GetPatchVersion();
      uVar9 = cmVersion::GetTweakVersion();
      local_214 = 0;
      local_218 = 0;
      iVar5 = __isoc99_sscanf(local_210,"%u.%u.%u.%u");
      if (iVar5 < 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"could not parse VERSION \"",0x19);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_210->_M_local_buf,local_208);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".",2);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_238);
        goto LAB_0022e5c4;
      }
      if (((uVar7 != 0 || uVar6 != 0) || local_214 <= uVar8) &&
         (((uVar7 != 0 || uVar6 != 0) || uVar8 != local_214 || (local_218 <= uVar9)))) {
        bVar4 = EnforceUnknownArguments(this,&local_1c8);
        if (bVar4) {
          pcVar3 = (this->super_cmCommand).Makefile;
          local_1a8._0_8_ = paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.","");
          cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != paVar1) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
          pcVar3 = (this->super_cmCommand).Makefile;
          local_1a8._0_8_ = paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"2.4","");
          cmMakefile::SetPolicyVersion(pcVar3,(string *)local_1a8,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != paVar1) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
          goto LAB_0022e7b4;
        }
        goto LAB_0022e600;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"CMake ",6);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_210->_M_local_buf,local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," or higher is required.  You are running version ",0x31);
      __s = cmVersion::GetCMakeVersion();
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
      }
      else {
        sVar12 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,__s,sVar12);
      }
      pcVar3 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
LAB_0022e7b4:
      bVar4 = true;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&local_1f0);
      if ((local_208 != 0) && (local_1c8._M_string_length != 0)) goto LAB_0022e498;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"VERSION \"",9);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_1f0,local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"\" does not have a version on both sides of \"...\".",0x31);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_238);
LAB_0022e5c4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
LAB_0022e600:
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    if (local_210 == &local_200) goto LAB_0022e7f2;
  }
  operator_delete(local_210,local_200._M_allocated_capacity + 1);
LAB_0022e7f2:
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  return bVar4;
}

Assistant:

bool cmCMakeMinimumRequired::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  // Process arguments.
  std::string version_string;
  bool doing_version = false;
  for (std::string const& arg : args) {
    if (arg == "VERSION") {
      doing_version = true;
    } else if (arg == "FATAL_ERROR") {
      if (doing_version) {
        this->SetError("called with no value for VERSION.");
        return false;
      }
      doing_version = false;
    } else if (doing_version) {
      doing_version = false;
      version_string = arg;
    } else {
      this->UnknownArguments.push_back(arg);
    }
  }
  if (doing_version) {
    this->SetError("called with no value for VERSION.");
    return false;
  }

  // Make sure there was a version to check.
  if (version_string.empty()) {
    return this->EnforceUnknownArguments(std::string());
  }

  // Separate the <min> version and any trailing ...<max> component.
  std::string::size_type const dd = version_string.find("...");
  std::string const version_min = version_string.substr(0, dd);
  std::string const version_max = dd != std::string::npos
    ? version_string.substr(dd + 3, std::string::npos)
    : std::string();
  if (dd != std::string::npos &&
      (version_min.empty() || version_max.empty())) {
    std::ostringstream e;
    e << "VERSION \"" << version_string
      << "\" does not have a version on both sides of \"...\".";
    this->SetError(e.str());
    return false;
  }

  // Save the required version string.
  this->Makefile->AddDefinition("CMAKE_MINIMUM_REQUIRED_VERSION",
                                version_min.c_str());

  // Get the current version number.
  unsigned int current_major = cmVersion::GetMajorVersion();
  unsigned int current_minor = cmVersion::GetMinorVersion();
  unsigned int current_patch = cmVersion::GetPatchVersion();
  unsigned int current_tweak = cmVersion::GetTweakVersion();

  // Parse at least two components of the version number.
  // Use zero for those not specified.
  unsigned int required_major = 0;
  unsigned int required_minor = 0;
  unsigned int required_patch = 0;
  unsigned int required_tweak = 0;
  if (sscanf(version_min.c_str(), "%u.%u.%u.%u", &required_major,
             &required_minor, &required_patch, &required_tweak) < 2) {
    std::ostringstream e;
    e << "could not parse VERSION \"" << version_min << "\".";
    this->SetError(e.str());
    return false;
  }

  // Compare the version numbers.
  if ((current_major < required_major) ||
      (current_major == required_major && current_minor < required_minor) ||
      (current_major == required_major && current_minor == required_minor &&
       current_patch < required_patch) ||
      (current_major == required_major && current_minor == required_minor &&
       current_patch == required_patch && current_tweak < required_tweak)) {
    // The current version is too low.
    std::ostringstream e;
    e << "CMake " << version_min
      << " or higher is required.  You are running version "
      << cmVersion::GetCMakeVersion();
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }

  // The version is not from the future, so enforce unknown arguments.
  if (!this->EnforceUnknownArguments(version_max)) {
    return false;
  }

  if (required_major < 2 || (required_major == 2 && required_minor < 4)) {
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.");
    this->Makefile->SetPolicyVersion("2.4", version_max);
  } else {
    this->Makefile->SetPolicyVersion(version_min, version_max);
  }

  return true;
}